

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insyde_fdm.cpp
# Opt level: O1

void __thiscall insyde_fdm_t::fdm_extensions_t::_read(fdm_extensions_t *this)

{
  vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>>>
  *this_00;
  bool bVar1;
  pointer __p;
  pointer __p_00;
  fdm_extension_t *this_01;
  pointer *__ptr;
  _Head_base<0UL,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_*,_false>
  local_28;
  
  __p_00 = (pointer)operator_new(0x18);
  (__p_00->
  super__Vector_base<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p_00->
  super__Vector_base<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p_00->
  super__Vector_base<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_head_impl =
       (vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
        *)0x0;
  std::
  __uniq_ptr_impl<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
           *)&this->m_extensions,__p_00);
  std::
  unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
                 *)&local_28);
  bVar1 = kaitai::kstream::is_eof((this->super_kstruct).m__io);
  while (!bVar1) {
    this_00 = (vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>>>
               *)(this->m_extensions)._M_t.
                 super___uniq_ptr_impl<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_*,_std::default_delete<std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_>_>
                 .
                 super__Head_base<0UL,_std::vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>_*,_false>
                 ._M_head_impl;
    this_01 = (fdm_extension_t *)operator_new(0x28);
    fdm_extension_t::fdm_extension_t(this_01,(this->super_kstruct).m__io,this,this->m__root);
    local_28._M_head_impl =
         (vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
          *)this_01;
    std::
    vector<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>,std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>>>
    ::
    emplace_back<std::unique_ptr<insyde_fdm_t::fdm_extension_t,std::default_delete<insyde_fdm_t::fdm_extension_t>>>
              (this_00,(unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>
                        *)&local_28);
    if ((fdm_extension_t *)local_28._M_head_impl != (fdm_extension_t *)0x0) {
      (*(code *)((local_28._M_head_impl)->
                super__Vector_base<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>,_std::allocator<std::unique_ptr<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_t.
                super___uniq_ptr_impl<insyde_fdm_t::fdm_extension_t,_std::default_delete<insyde_fdm_t::fdm_extension_t>_>
      )();
    }
    bVar1 = kaitai::kstream::is_eof((this->super_kstruct).m__io);
  }
  return;
}

Assistant:

void insyde_fdm_t::fdm_extensions_t::_read() {
    m_extensions = std::unique_ptr<std::vector<std::unique_ptr<fdm_extension_t>>>(new std::vector<std::unique_ptr<fdm_extension_t>>());
    {
        int i = 0;
        while (!m__io->is_eof()) {
            m_extensions->push_back(std::move(std::unique_ptr<fdm_extension_t>(new fdm_extension_t(m__io, this, m__root))));
            i++;
        }
    }
}